

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

bool TranslateModule(ExpressionTranslateContext *ctx,ExprModule *expression,
                    SmallArray<const_char_*,_32U> *dependencies)

{
  TypeBase *pTVar1;
  bool bVar2;
  uint uVar3;
  TypeBase **ppTVar4;
  FunctionData **ppFVar5;
  ModuleData **ppMVar6;
  char *pcVar7;
  ExprBase *local_98;
  ExprBase *value_1;
  ExprBase *value;
  ModuleData *data_1;
  uint i_3;
  ModuleData *data;
  uint i_2;
  FunctionData *function;
  uint i_1;
  TypeBase *type;
  uint i;
  SmallArray<const_char_*,_32U> *dependencies_local;
  ExprModule *expression_local;
  ExpressionTranslateContext *ctx_local;
  
  bVar2 = TranslateModuleImports(ctx,dependencies);
  if (bVar2) {
    type._4_4_ = 0;
    while( true ) {
      uVar3 = SmallArray<TypeBase_*,_128U>::size(&ctx->ctx->types);
      if (uVar3 <= type._4_4_) break;
      ppTVar4 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,type._4_4_);
      pTVar1 = *ppTVar4;
      pTVar1->typeIndex = type._4_4_;
      pTVar1->hasTranslation = false;
      type._4_4_ = type._4_4_ + 1;
    }
    function._4_4_ = 0;
    while( true ) {
      uVar3 = SmallArray<FunctionData_*,_128U>::size(&ctx->ctx->functions);
      if (uVar3 <= function._4_4_) break;
      ppFVar5 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->ctx->functions,function._4_4_);
      (*ppFVar5)->nextTranslateRestoreBlock = 1;
      function._4_4_ = function._4_4_ + 1;
    }
    PrintIndentedLine(ctx,"#include \"runtime.h\"");
    PrintIndentedLine(ctx,"// Typeid redirect table");
    uVar3 = SmallArray<TypeBase_*,_128U>::size(&ctx->ctx->types);
    PrintIndentedLine(ctx,"static unsigned __nullcTR[%d];",(ulong)uVar3);
    PrintIndentedLine(ctx,"// Function pointer table");
    PrintIndentedLine(ctx,"static __nullcFunctionArray* __nullcFM;");
    PrintIndentedLine(ctx,"// Function pointer redirect table");
    uVar3 = SmallArray<FunctionData_*,_128U>::size(&ctx->ctx->functions);
    PrintIndentedLine(ctx,"static unsigned __nullcFR[%d];",(ulong)uVar3);
    PrintLine(ctx);
    TranslateModuleTypePrototypes(ctx);
    TranslateModuleTypeDefinitions(ctx);
    TranslateModuleFunctionPrototypes(ctx);
    TranslateModuleGlobalVariables(ctx);
    TranslateModuleFunctionDefinitions(ctx,expression);
    PrintIndentedLine(ctx,"// Module initializers");
    data._4_4_ = 1;
    while( true ) {
      uVar3 = SmallArray<ModuleData_*,_128U>::size(&ctx->ctx->imports);
      if (uVar3 <= data._4_4_) break;
      ppMVar6 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->ctx->imports,data._4_4_);
      pcVar7 = GetModuleMainName(ctx->allocator,(*ppMVar6)->name);
      PrintIndentedLine(ctx,"extern int %s();",pcVar7);
      data._4_4_ = data._4_4_ + 1;
    }
    PrintLine(ctx);
    PrintIndentedLine(ctx,"// Global code");
    PrintIndentedLine(ctx,"int %s()",ctx->mainName);
    PrintIndentedLine(ctx,"{");
    ctx->depth = ctx->depth + 1;
    PrintIndentedLine(ctx,"static int moduleInitialized = 0;");
    PrintIndentedLine(ctx,"if(moduleInitialized++)");
    ctx->depth = ctx->depth + 1;
    PrintIndentedLine(ctx,"return 0;");
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"static int pointerSizeTest[sizeof(void*) == %d ? 1 : -1];",8);
    PrintIndentedLine(ctx,"__nullcFM = __nullcGetFunctionTable();");
    PrintIndentedLine(ctx,"int __local = 0;");
    PrintIndentedLine(ctx,"__nullcRegisterBase(&__local);");
    PrintIndentedLine(ctx,"__nullcInitBaseModule();");
    PrintLine(ctx);
    PrintIndentedLine(ctx,"// Initialize modules");
    data_1._4_4_ = 1;
    while( true ) {
      uVar3 = SmallArray<ModuleData_*,_128U>::size(&ctx->ctx->imports);
      if (uVar3 <= data_1._4_4_) break;
      ppMVar6 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->ctx->imports,data_1._4_4_);
      pcVar7 = GetModuleMainName(ctx->allocator,(*ppMVar6)->name);
      PrintIndentedLine(ctx,"%s();",pcVar7);
      data_1._4_4_ = data_1._4_4_ + 1;
    }
    PrintLine(ctx);
    TranslateModuleTypeInformation(ctx);
    TranslateModuleGlobalVariableInformation(ctx);
    TranslateModuleGlobalFunctionInformation(ctx);
    PrintIndentedLine(ctx,"// Setup");
    for (value_1 = (expression->setup).head; value_1 != (ExprBase *)0x0; value_1 = value_1->next) {
      PrintIndent(ctx);
      Translate(ctx,value_1);
      Print(ctx,";");
      PrintLine(ctx);
    }
    PrintLine(ctx);
    PrintIndentedLine(ctx,"// Expressions");
    for (local_98 = (expression->expressions).head; local_98 != (ExprBase *)0x0;
        local_98 = local_98->next) {
      PrintIndent(ctx);
      Translate(ctx,local_98);
      Print(ctx,";");
      PrintLine(ctx);
    }
    PrintIndentedLine(ctx,"return 0;");
    ctx->depth = ctx->depth - 1;
    PrintIndentedLine(ctx,"}");
    OutputContext::Flush(ctx->output);
    ctx_local._7_1_ = true;
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

bool TranslateModule(ExpressionTranslateContext &ctx, ExprModule *expression, SmallArray<const char*, 32> &dependencies)
{
	if(!TranslateModuleImports(ctx, dependencies))
		return false;

	// Generate type indexes
	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		type->typeIndex = i;

		type->hasTranslation = false;
	}

	// Generate function indexes
	for(unsigned i = 0; i < ctx.ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.ctx.functions[i];

		function->nextTranslateRestoreBlock = 1;
	}

	PrintIndentedLine(ctx, "#include \"runtime.h\"");
	PrintIndentedLine(ctx, "// Typeid redirect table");
	PrintIndentedLine(ctx, "static unsigned __nullcTR[%d];", ctx.ctx.types.size());
	PrintIndentedLine(ctx, "// Function pointer table");
	PrintIndentedLine(ctx, "static __nullcFunctionArray* __nullcFM;");
	PrintIndentedLine(ctx, "// Function pointer redirect table");
	PrintIndentedLine(ctx, "static unsigned __nullcFR[%d];", ctx.ctx.functions.size());
	PrintLine(ctx);

	TranslateModuleTypePrototypes(ctx);

	TranslateModuleTypeDefinitions(ctx);
	
	TranslateModuleFunctionPrototypes(ctx);

	TranslateModuleGlobalVariables(ctx);
	
	TranslateModuleFunctionDefinitions(ctx, expression);

	PrintIndentedLine(ctx, "// Module initializers");

	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "extern int %s();", GetModuleMainName(ctx.allocator, data->name));
	}

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Global code");

	PrintIndentedLine(ctx, "int %s()", ctx.mainName);
	PrintIndentedLine(ctx, "{");

	ctx.depth++;

	PrintIndentedLine(ctx, "static int moduleInitialized = 0;");
	PrintIndentedLine(ctx, "if(moduleInitialized++)");

	ctx.depth++;
	PrintIndentedLine(ctx, "return 0;");
	ctx.depth--;

	PrintIndentedLine(ctx, "static int pointerSizeTest[sizeof(void*) == %d ? 1 : -1];", int(sizeof(void*)));

	PrintIndentedLine(ctx, "__nullcFM = __nullcGetFunctionTable();");
	PrintIndentedLine(ctx, "int __local = 0;");
	PrintIndentedLine(ctx, "__nullcRegisterBase(&__local);");
	PrintIndentedLine(ctx, "__nullcInitBaseModule();");

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Initialize modules");

	for(unsigned i = 1; i < ctx.ctx.imports.size(); i++)
	{
		ModuleData *data = ctx.ctx.imports[i];

		PrintIndentedLine(ctx, "%s();", GetModuleMainName(ctx.allocator, data->name));
	}

	PrintLine(ctx);

	TranslateModuleTypeInformation(ctx);
	
	TranslateModuleGlobalVariableInformation(ctx);
	
	TranslateModuleGlobalFunctionInformation(ctx);
	
	PrintIndentedLine(ctx, "// Setup");

	for(ExprBase *value = expression->setup.head; value; value = value->next)
	{
		PrintIndent(ctx);

		Translate(ctx, value);

		Print(ctx, ";");

		PrintLine(ctx);
	}

	PrintLine(ctx);
	PrintIndentedLine(ctx, "// Expressions");

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		PrintIndent(ctx);

		Translate(ctx, value);

		Print(ctx, ";");

		PrintLine(ctx);
	}

	PrintIndentedLine(ctx, "return 0;");

	ctx.depth--;

	PrintIndentedLine(ctx, "}");

	ctx.output.Flush();

	return true;
}